

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O0

void cuddShrinkDeathRow(DdManager *table)

{
  DdNode **local_28;
  int local_14;
  int i;
  DdManager *table_local;
  
  if (3 < table->deathRowDepth) {
    for (local_14 = table->deathRowDepth / 4;
        (local_14 < table->deathRowDepth && (table->deathRow[local_14] != (DdNode *)0x0));
        local_14 = local_14 + 1) {
      Cudd_IterDerefBdd(table,table->deathRow[local_14]);
      table->deathRow[local_14] = (DdNode *)0x0;
    }
    table->deathRowDepth = table->deathRowDepth / 4;
    table->deadMask = table->deathRowDepth - 1;
    if (table->deadMask < (uint)table->nextDead) {
      table->nextDead = 0;
    }
    if (table->deathRow == (DdNode **)0x0) {
      local_28 = (DdNode **)malloc((long)table->deathRowDepth << 3);
    }
    else {
      local_28 = (DdNode **)realloc(table->deathRow,(long)table->deathRowDepth << 3);
    }
    table->deathRow = local_28;
  }
  return;
}

Assistant:

void
cuddShrinkDeathRow(
  DdManager *table)
{
#ifndef DD_NO_DEATH_ROW
    int i;

    if (table->deathRowDepth > 3) {
        for (i = table->deathRowDepth/4; i < table->deathRowDepth; i++) {
            if (table->deathRow[i] == NULL) break;
            Cudd_IterDerefBdd(table,table->deathRow[i]);
            table->deathRow[i] = NULL;
        }
        table->deathRowDepth /= 4;
        table->deadMask = table->deathRowDepth - 1;
        if ((unsigned) table->nextDead > table->deadMask) {
            table->nextDead = 0;
        }
        table->deathRow = ABC_REALLOC(DdNodePtr, table->deathRow,
                                   table->deathRowDepth);
    }
#endif

}